

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getRhoh(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_80;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_80);
  return (RealType)local_80;
}

Assistant:

RealType EAMAdapter::getRhoh() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.rhoh;
  }